

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O2

string * __thiscall
chaiscript::exception::eval_error::format_parameters_abi_cxx11_
          (string *__return_storage_ptr__,eval_error *this,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *t_parameters,
          bool t_dot_notation,Dispatch_Engine *t_ss)

{
  Boxed_Value *pBVar1;
  undefined7 in_register_00000009;
  char *__s;
  const_iterator itr;
  Boxed_Value *obj;
  string paramstr;
  stringstream ss;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,"(");
  obj = *(Boxed_Value **)this;
  pBVar1 = *(Boxed_Value **)&this->field_0x8;
  if (obj != pBVar1) {
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    local_1d8._M_string_length = 0;
    local_1d8.field_2._M_local_buf[0] = '\0';
    for (; obj != pBVar1; obj = obj + 1) {
      __s = "";
      if (((((obj->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_type_info).m_flags & 1) != 0) {
        __s = "const ";
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_1d8,__s);
      detail::Dispatch_Engine::type_name_abi_cxx11_
                (&local_1f8,(Dispatch_Engine *)CONCAT71(in_register_00000009,t_dot_notation),obj);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_1d8,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      if (obj == *(Boxed_Value **)this && (char)t_parameters == '\x01') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_1d8,").(");
        if (*(long *)&this->field_0x8 - *(long *)this == 0x10) goto LAB_003c5a16;
      }
      else {
LAB_003c5a16:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_1d8,", ");
      }
      pBVar1 = *(Boxed_Value **)&this->field_0x8;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_1f8,&local_1d8,0,local_1d8._M_string_length - 2);
    std::operator<<(local_1a8,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  std::operator<<(local_1a8,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

static std::string
      format_parameters(const std::vector<Boxed_Value> &t_parameters, bool t_dot_notation, const chaiscript::detail::Dispatch_Engine &t_ss) {
        std::stringstream ss;
        ss << "(";

        if (!t_parameters.empty()) {
          std::string paramstr;

          for (auto itr = t_parameters.begin(); itr != t_parameters.end(); ++itr) {
            paramstr += (itr->is_const() ? "const " : "");
            paramstr += t_ss.type_name(*itr);

            if (itr == t_parameters.begin() && t_dot_notation) {
              paramstr += ").(";
              if (t_parameters.size() == 1) {
                paramstr += ", ";
              }
            } else {
              paramstr += ", ";
            }
          }

          ss << paramstr.substr(0, paramstr.size() - 2);
        }
        ss << ")";

        return ss.str();
      }